

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

unsigned_long TJBUFSIZE(int width,int height)

{
  char *__s;
  int in_ESI;
  int in_EDI;
  unsigned_long_long retval;
  unsigned_long local_10;
  
  if ((in_EDI < 1) || (in_ESI < 1)) {
    __s = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(__s,200,"%s","TJBUFSIZE(): Invalid argument");
    local_10 = 0xffffffffffffffff;
  }
  else {
    local_10 = (long)(int)((in_EDI + 0xfU & 0xfffffff0) * (in_ESI + 0xfU & 0xfffffff0)) * 6 + 0x800;
  }
  return local_10;
}

Assistant:

DLLEXPORT unsigned long TJBUFSIZE(int width, int height)
{
  unsigned long long retval = 0;

  if (width < 1 || height < 1)
    THROWG("TJBUFSIZE(): Invalid argument");

  /* This allows for rare corner cases in which a JPEG image can actually be
     larger than the uncompressed input (we wouldn't mention it if it hadn't
     happened before.) */
  retval = PAD(width, 16) * PAD(height, 16) * 6ULL + 2048ULL;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("TJBUFSIZE(): Image is too large");

bailout:
  return (unsigned long)retval;
}